

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O1

void locatePath(char **path,uint *pathLength,char *relPath,uint relPathLength,char *systemDir,
               uint systemDirLength,void *symbol)

{
  uchar uVar1;
  char *path_00;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __n;
  uint uVar7;
  ulong __n_00;
  int iVar8;
  bool bVar9;
  uint systemBasePathLength;
  uint bundlePathLength;
  uint executablePathDirectoryLength;
  char *bundlePath;
  char *executablePath;
  uint lengths [3];
  char *dir;
  char *libraryPath;
  uint libraryPathDirectoryLength;
  uint libraryPathLength;
  uint executablePathLength;
  char *dirs [3];
  uint local_dc;
  uint local_d8;
  uint local_d4;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  char *local_b8;
  char *local_b0;
  uint local_a4 [3];
  char *local_98;
  ulong local_90;
  ulong local_88;
  char *local_80;
  char *local_78;
  uint *local_70;
  ulong local_68;
  char *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  char *local_48 [3];
  
  __n_00 = (ulong)relPathLength;
  local_80 = systemDir;
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    local_b0 = (char *)0x0;
    local_4c = 0;
    getExecutablePath(&local_b0,&local_4c);
    local_d4 = 0;
    local_b8 = (char *)0x0;
    local_d8 = 0;
    getBundlePath(&local_b8,&local_d8);
    local_60 = (char *)0x0;
    local_50 = 0;
    local_c8 = (ulong)systemDirLength;
    getLibraryPath(symbol,&local_60,&local_50);
    local_54 = 0;
    getDirectoryPart(local_60,local_50,&local_54);
    getDirectoryPart(local_b0,local_4c,&local_d4);
    uVar3 = local_54;
    if (local_54 < local_d4) {
      uVar3 = local_d4;
    }
    local_a4[0] = local_54;
    local_90 = (ulong)local_d8;
    if (uVar3 <= local_d8 + 0x13) {
      uVar3 = local_d8 + 0x13;
    }
    uVar6 = 0;
    local_48[0] = local_60;
    local_48[1] = local_b0;
    local_98 = local_b8;
    local_48[2] = local_b8;
    local_a4[1] = local_d4;
    local_a4[2] = local_d8;
    path_00 = (char *)malloc((ulong)(relPathLength + uVar3 + 9));
    local_88 = local_c8 & 0xffffffff;
    puVar2 = (uint *)0x0;
    local_d0 = __n_00;
    do {
      local_70 = puVar2;
      uVar3 = local_a4[uVar6];
      uVar4 = (ulong)uVar3;
      uVar5 = 0;
      if (uVar4 != 0) {
        local_68 = uVar6;
        local_78 = local_48[uVar6];
        memcpy(path_00,local_78,uVar4);
        __n = 1;
        local_c0 = uVar4;
        do {
          memcpy(path_00 + uVar4,"/../../",__n);
          uVar6 = local_c0 + __n;
          memcpy(path_00 + (uVar6 & 0xffffffff),relPath,__n_00);
          uVar5 = uVar3 + relPathLength + (int)__n;
          path_00[uVar5] = '\0';
          uVar1 = fileExists(path_00,uVar5);
          if (uVar1 != '\0') {
            puVar2 = pathLength;
            copyToStringOutParameter(path_00,(uint)uVar6,path,pathLength);
            uVar3 = 8;
            goto LAB_001016fe;
          }
          __n = __n + 3;
        } while (__n != 10);
        uVar3 = 5;
LAB_001016fe:
        uVar6 = local_68;
        iVar8 = (int)local_c8;
        uVar5 = uVar3;
        if (uVar3 == 5) {
          uVar5 = 0;
        }
        puVar2 = (uint *)((ulong)puVar2 & 0xffffffffffffff00);
        if (uVar3 == 5 && iVar8 != 0) {
          getSystemBasePath(local_78,(int)local_c0 + 1,&local_dc);
          uVar3 = local_dc;
          uVar5 = 0;
          if ((ulong)local_dc != 0) {
            path_00[local_dc] = '/';
            memcpy(path_00 + (local_dc + 1),local_80,local_88);
            uVar7 = uVar3 + iVar8 + 1;
            path_00[uVar7] = '/';
            uVar3 = uVar3 + 2 + iVar8;
            memcpy(path_00 + uVar3,relPath,__n_00);
            uVar7 = (int)local_d0 + uVar7 + 1;
            path_00[uVar7] = '\0';
            uVar1 = fileExists(path_00,uVar7);
            if (uVar1 != '\0') {
              puVar2 = pathLength;
              copyToStringOutParameter(path_00,uVar3,path,pathLength);
              uVar5 = 8;
            }
          }
        }
      }
      uVar4 = local_90;
      if ((uVar5 & 0xb) != 0) {
        if (((ulong)local_70 & 1) == 0) goto LAB_0010187f;
        break;
      }
      bVar9 = 1 < uVar6;
      uVar6 = uVar6 + 1;
      puVar2 = (uint *)CONCAT71((int7)((ulong)puVar2 >> 8),bVar9);
    } while (uVar6 != 3);
    memcpy(path_00,local_98,local_90);
    builtin_strncpy(path_00 + uVar4,"/Contents/Resources/",0x14);
    iVar8 = (int)uVar4;
    uVar3 = iVar8 + 0x14;
    memcpy(path_00 + uVar3,relPath,__n_00);
    uVar5 = iVar8 + (int)local_d0 + 0x14;
    path_00[uVar5] = '\0';
    uVar1 = fileExists(path_00,uVar5);
    if (uVar1 == '\0') {
      invalidateStringOutParameter(path,pathLength);
    }
    else {
      copyToStringOutParameter(path_00,uVar3,path,pathLength);
    }
LAB_0010187f:
    free(local_60);
    free(local_b0);
    free(local_b8);
    free(path_00);
  }
  return;
}

Assistant:

void locatePath(char ** path, unsigned int * pathLength, const char * relPath, unsigned int relPathLength,
    const char * systemDir, unsigned int systemDirLength, void * symbol)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Obtain executable path
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    // Obtain bundle path (in case of macOS)
    char * bundlePath = 0x0;
    unsigned int bundlePathLength = 0;
    getBundlePath(&bundlePath, &bundlePathLength);

    // Obtain library path
    char * libraryPath = 0x0;
    unsigned int libraryPathLength = 0;
    getLibraryPath(symbol, &libraryPath, &libraryPathLength);
    unsigned int libraryPathDirectoryLength = 0;

    // Extract directory parts of executable and library paths
    getDirectoryPart(libraryPath, libraryPathLength, &libraryPathDirectoryLength);
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Compute the size of the maximal possible path to circumvent reallocation of output
    unsigned int maxLength = executablePathDirectoryLength;
    maxLength = maxLength > libraryPathDirectoryLength ? maxLength : libraryPathDirectoryLength;
    maxLength = maxLength > bundlePathLength + 19 ? maxLength : bundlePathLength + 19; // for "/Contents/Resources"
    maxLength += relPathLength + 7 + 2; // for the extra upward path checks, the extra path delimiter and null byte suffix

    const char * dirs[] = { libraryPath, executablePath, bundlePath };
    const unsigned int lengths[] = { libraryPathDirectoryLength, executablePathDirectoryLength, bundlePathLength };

    char * subdir = (char *)malloc(sizeof(char) * maxLength);
    unsigned int subdirLength = 0;
    unsigned int resultdirLength = 0;

    // Check libraryPath, executablePath, and bundlePath as base directories
    for (unsigned char i = 0; i < 3; ++i)
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[i];
        const unsigned int length = lengths[i];

        // Early out for missing base directory
        if (length <= 0)
        {
            continue;
        }

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        // Check <basedir>/<relpath>, <basedir>/../<relpath>, and <basedir>/../../<relpath>
        for (unsigned char j = 0; j < 3; ++j)
        {
            unsigned char relDirLength = j * 3 + 1;

            subdirLength = length;
            // Copy either '/', '/../', or '/../../', depending on current iteration
            memcpy(subdir+subdirLength, "/../../", relDirLength);
            subdirLength += relDirLength;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }

        if (systemDirLength <= 0)
            continue;

        // Check if it is a system path
        // length + 1 points to the '/' of the directory part of the path

        unsigned int systemBasePathLength;
        getSystemBasePath(dir, length + 1, &systemBasePathLength);

        if (systemBasePathLength > 0)
        {
            subdirLength = systemBasePathLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, systemDir, systemDirLength);
            subdirLength += systemDirLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }
    }

    // Check app bundle resources
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[2];
        const unsigned int length = lengths[2];

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        subdirLength = length;
        memcpy(subdir+subdirLength, "/Contents/Resources/", 20);
        subdirLength += 20;
        memcpy(subdir+subdirLength, relPath, relPathLength);
        resultdirLength = subdirLength;
        subdirLength += relPathLength;

        // End subdirectory with null byte for system functions
        subdir[subdirLength] = 0;

        if (fileExists(subdir, subdirLength)) // successfully found directory
        {
            copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

            goto out;
        }
    }

    // Could not find path
    invalidateStringOutParameter(path, pathLength);

out:
    // Free temporary memory
    free(libraryPath);
    free(executablePath);
    free(bundlePath);
    free(subdir);
}